

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternAddressMapper.cpp
# Opt level: O2

void __thiscall
PatternAddressMapper::PatternAddressMapper(PatternAddressMapper *this,PatternAddressMapper *other)

{
  CodeJitter *pCVar1;
  CodeJitter *pCVar2;
  undefined1 __p [8];
  uint uVar3;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2758;
  undefined1 local_13d0 [8];
  random_device rd;
  
  std::
  _Hashtable<volatile_char_*,_volatile_char_*,_std::allocator<volatile_char_*>,_std::__detail::_Identity,_std::equal_to<volatile_char_*>,_std::hash<volatile_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_Hashtable((_Hashtable<volatile_char_*,_volatile_char_*,_std::allocator<volatile_char_*>,_std::__detail::_Identity,_std::equal_to<volatile_char_*>,_std::hash<volatile_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)this,(_Hashtable<volatile_char_*,_volatile_char_*,_std::allocator<volatile_char_*>,_std::__detail::_Identity,_std::equal_to<volatile_char_*>,_std::hash<volatile_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)other);
  std::__cxx11::string::string((string *)&this->instance_id,(string *)&other->instance_id);
  rd.field_0._M_mt._M_p = (size_t)&this->instance_id;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&this->gen);
  (this->code_jitter)._M_t.super___uniq_ptr_impl<CodeJitter,_std::default_delete<CodeJitter>_>._M_t.
  super__Tuple_impl<0UL,_CodeJitter_*,_std::default_delete<CodeJitter>_>.
  super__Head_base<0UL,_CodeJitter_*,_false>._M_head_impl = (CodeJitter *)0x0;
  this->min_row = other->min_row;
  this->max_row = other->max_row;
  this->bank_no = other->bank_no;
  std::
  _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&(this->aggressor_to_addr)._M_h,&(other->aggressor_to_addr)._M_h);
  std::
  vector<std::vector<BitFlip,_std::allocator<BitFlip>_>,_std::allocator<std::vector<BitFlip,_std::allocator<BitFlip>_>_>_>
  ::vector(&this->bit_flips,&other->bit_flips);
  this->reproducibility_score = other->reproducibility_score;
  std::make_unique<CodeJitter>();
  __p = local_13d0;
  local_13d0 = (undefined1  [8])0x0;
  std::__uniq_ptr_impl<CodeJitter,_std::default_delete<CodeJitter>_>::reset
            ((__uniq_ptr_impl<CodeJitter,_std::default_delete<CodeJitter>_> *)&this->code_jitter,
             (pointer)__p);
  std::unique_ptr<CodeJitter,_std::default_delete<CodeJitter>_>::~unique_ptr
            ((unique_ptr<CodeJitter,_std::default_delete<CodeJitter>_> *)local_13d0);
  pCVar1 = (other->code_jitter)._M_t.
           super___uniq_ptr_impl<CodeJitter,_std::default_delete<CodeJitter>_>._M_t.
           super__Tuple_impl<0UL,_CodeJitter_*,_std::default_delete<CodeJitter>_>.
           super__Head_base<0UL,_CodeJitter_*,_false>._M_head_impl;
  pCVar2 = (this->code_jitter)._M_t.
           super___uniq_ptr_impl<CodeJitter,_std::default_delete<CodeJitter>_>._M_t.
           super__Tuple_impl<0UL,_CodeJitter_*,_std::default_delete<CodeJitter>_>.
           super__Head_base<0UL,_CodeJitter_*,_false>._M_head_impl;
  pCVar2->num_aggs_for_sync = pCVar1->num_aggs_for_sync;
  pCVar2->total_activations = pCVar1->total_activations;
  pCVar2->fencing_strategy = pCVar1->fencing_strategy;
  pCVar2->flushing_strategy = pCVar1->flushing_strategy;
  pCVar2->pattern_sync_each_ref = pCVar1->pattern_sync_each_ref;
  std::random_device::random_device((random_device *)local_13d0);
  uVar3 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_2758,(ulong)uVar3);
  memcpy(&this->gen,&local_2758,5000);
  std::random_device::~random_device((random_device *)local_13d0);
  return;
}

Assistant:

PatternAddressMapper::PatternAddressMapper(const PatternAddressMapper &other)
    : victim_rows(other.victim_rows),
      instance_id(other.instance_id),
      min_row(other.min_row),
      max_row(other.max_row),
      bank_no(other.bank_no),
      aggressor_to_addr(other.aggressor_to_addr),
      bit_flips(other.bit_flips),
      reproducibility_score(other.reproducibility_score) {
  code_jitter = std::make_unique<CodeJitter>();
  code_jitter->num_aggs_for_sync = other.get_code_jitter().num_aggs_for_sync;
  code_jitter->total_activations = other.get_code_jitter().total_activations;
  code_jitter->fencing_strategy = other.get_code_jitter().fencing_strategy;
  code_jitter->flushing_strategy = other.get_code_jitter().flushing_strategy;
  code_jitter->pattern_sync_each_ref = other.get_code_jitter().pattern_sync_each_ref;
  std::random_device rd;
  gen = std::mt19937(rd());
}